

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedReceive>
::fulfill(AdapterPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedReceive>
          *this,OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *value)

{
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *value_00;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> local_1a8;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *local_18;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *value_local;
  AdapterPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedReceive>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)this;
    value_00 = mv<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>(value);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::ExceptionOr
              (&local_1a8,value_00);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::operator=
              (&this->result,&local_1a8);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
    ~ExceptionOr(&local_1a8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }